

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Log::~Log(Log *this)

{
  *(undefined ***)this = &PTR__Log_001d9c08;
  sync(this);
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  ~vector(&this->log_sinks_);
  Metadata::~Metadata(&this->metadata_);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->buffer_)._M_t);
  std::streambuf::~streambuf((streambuf *)this);
  return;
}

Assistant:

virtual ~Log() { sync(); }